

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_MonsterMove
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *actor;
  char *__assertion;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f386a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f3813:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f386a:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x31b,
                  "int AF_AActor_MonsterMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (actor != (AActor *)0x0) {
      pPVar3 = (actor->super_DThinker).super_DObject.Class;
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
        (actor->super_DThinker).super_DObject.Class = pPVar3;
      }
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar1 && bVar4) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar4 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar1) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (!bVar4) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003f386a;
      }
      goto LAB_003f37e3;
    }
  }
  else if (actor != (AActor *)0x0) goto LAB_003f3813;
  actor = (AActor *)0x0;
LAB_003f37e3:
  bVar4 = P_Move(actor);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x31c,
                    "int AF_AActor_MonsterMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)bVar4;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, MonsterMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(P_Move(self));
}